

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O1

void __thiscall Assimp::MD3Importer::~MD3Importer(MD3Importer *this)

{
  pointer pcVar1;
  
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_00820570;
  pcVar1 = (this->filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filename).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->path)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->path).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mFile)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mFile).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->configShaderFile)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->configShaderFile).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->configSkinFile)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->configSkinFile).field_2) {
    operator_delete(pcVar1);
  }
  BaseImporter::~BaseImporter(&this->super_BaseImporter);
  return;
}

Assistant:

MD3Importer::~MD3Importer()
{}